

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::BuildVectorOfTableFromBytes
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  Value *this_00;
  Value *pVVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  size_t local_160;
  size_t elem_size;
  size_t alignment;
  Type vector_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string struct_type;
  string field_method;
  string *code;
  allocator<char> local_51;
  string local_50;
  Value *local_30;
  Value *nested;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  nested = (Value *)code_ptr;
  code_ptr_local = (string *)field;
  field_local = (FieldDef *)struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"nested_flatbuffer",&local_51);
  pVVar1 = SymbolTable<flatbuffers::Value>::Lookup(&(field->super_Definition).attributes,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  this_00 = nested;
  if (pVVar1 != (Value *)0x0) {
    local_30 = pVVar1;
    Namer::Method<flatbuffers::FieldDef>
              ((string *)((long)&struct_type.field_2 + 8),&(this->namer_).super_Namer,
               (FieldDef *)code_ptr_local);
    IdlNamer::Type_abi_cxx11_((string *)local_b0,&this->namer_,(StructDef *)field_local);
    std::operator+(&local_110,"def ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    std::operator+(&local_f0,&local_110,"Make");
    std::operator+(&local_d0,&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&struct_type.field_2 + 8));
    std::__cxx11::string::operator+=((string *)this_00,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::operator+=((string *)this_00,"VectorFromBytes(builder, bytes):\n");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &vector_type.fixed_length,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::Indent_abi_cxx11_,"builder.StartVector(");
    std::__cxx11::string::operator+=((string *)this_00,(string *)&vector_type.fixed_length);
    std::__cxx11::string::~string((string *)&vector_type.fixed_length);
    Type::VectorType((Type *)&alignment,(Type *)&code_ptr_local[6]._M_string_length);
    elem_size = InlineAlignment((Type *)&alignment);
    local_160 = InlineSize((Type *)&alignment);
    NumToString<unsigned_long>(&local_180,local_160);
    std::__cxx11::string::operator+=((string *)this_00,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    NumToString<unsigned_long>(&local_1c0,elem_size);
    std::operator+(&local_1a0,", len(bytes), ",&local_1c0);
    std::__cxx11::string::operator+=((string *)this_00,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::operator+=((string *)this_00,")\n");
    std::operator+(&local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::Indent_abi_cxx11_,
                   "builder.head = builder.head - len(bytes)\n");
    std::__cxx11::string::operator+=((string *)this_00,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator+(&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::Indent_abi_cxx11_,
                   "builder.Bytes[builder.head : builder.head + len(bytes)]");
    std::__cxx11::string::operator+=((string *)this_00,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::operator+=((string *)this_00," = bytes\n");
    std::operator+(&local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::Indent_abi_cxx11_,"return builder.EndVector()\n");
    std::__cxx11::string::operator+=((string *)this_00,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
      std::operator+(&local_260,"def Make",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&struct_type.field_2 + 8));
      std::operator+(&local_240,&local_260,"VectorFromBytes(builder, bytes):\n");
      std::__cxx11::string::operator+=((string *)this_00,(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::operator+(&local_300,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (anonymous_namespace)::Indent_abi_cxx11_,"return ");
      std::operator+(&local_2e0,&local_300,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
      std::operator+(&local_2c0,&local_2e0,"Make");
      std::operator+(&local_2a0,&local_2c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&struct_type.field_2 + 8));
      std::operator+(&local_280,&local_2a0,"VectorFromBytes(builder, bytes)\n");
      std::__cxx11::string::operator+=((string *)this_00,(string *)&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
    }
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)(struct_type.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void BuildVectorOfTableFromBytes(const StructDef &struct_def,
                                   const FieldDef &field,
                                   std::string *code_ptr) const {
    auto nested = field.attributes.Lookup("nested_flatbuffer");
    if (!nested) { return; }  // There is no nested flatbuffer.

    auto &code = *code_ptr;
    const std::string field_method = namer_.Method(field);
    const std::string struct_type = namer_.Type(struct_def);

    // Generate method with struct and field name.
    code += "def " + struct_type + "Make" + field_method;
    code += "VectorFromBytes(builder, bytes):\n";
    code += Indent + "builder.StartVector(";
    auto vector_type = field.value.type.VectorType();
    auto alignment = InlineAlignment(vector_type);
    auto elem_size = InlineSize(vector_type);
    code += NumToString(elem_size);
    code += ", len(bytes), " + NumToString(alignment);
    code += ")\n";
    code += Indent + "builder.head = builder.head - len(bytes)\n";
    code += Indent + "builder.Bytes[builder.head : builder.head + len(bytes)]";
    code += " = bytes\n";
    code += Indent + "return builder.EndVector()\n";

    if (!parser_.opts.one_file) {
      // Generate method without struct and field name.
      code += "def Make" + field_method + "VectorFromBytes(builder, bytes):\n";
      code += Indent + "return " + struct_type + "Make" + field_method +
              "VectorFromBytes(builder, bytes)\n";
    }
  }